

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86PUSH(uchar *stream,int num)

{
  uint uVar1;
  uchar *start;
  int num_local;
  uchar *stream_local;
  
  if ((char)num == num) {
    *stream = 'j';
    uVar1 = encodeImmByte(stream + 1,(char)num);
    stream_local._4_4_ = ((int)(stream + 1) + uVar1) - (int)stream;
  }
  else {
    *stream = 'h';
    uVar1 = encodeImmDword(stream + 1,num);
    stream_local._4_4_ = ((int)(stream + 1) + uVar1) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86PUSH(unsigned char *stream, int num)
{
	unsigned char *start = stream;

	if((char)(num) == num)
	{
		*stream++ = 0x6a;
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	*stream++ = 0x68;
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}